

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

int run_test_fs_open_dir(void)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar5;
  uv_loop_t *extraout_RAX;
  uv_loop_t *puVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 *__s1;
  __off64_t _Var9;
  void *pvVar10;
  void *pvVar11;
  undefined8 extraout_RAX_00;
  ulong unaff_RBX;
  char *pcVar12;
  char *pcVar13;
  uv_fs_t *puVar14;
  undefined1 *puVar15;
  long unaff_R12;
  ulong uVar16;
  uv_fs_t *unaff_R14;
  long lVar17;
  void *pvVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uv_buf_t uVar21;
  uv_fs_t req;
  undefined1 auStack_662 [2];
  code *pcStack_660;
  undefined8 uStack_658;
  void *pvStack_650;
  long lStack_648;
  undefined1 auStack_5d8 [16];
  undefined1 auStack_5c8 [16];
  undefined8 uStack_5b0;
  uv_fs_t *puStack_5a8;
  uv_fs_t *puStack_5a0;
  undefined8 uStack_598;
  code *pcStack_588;
  code *pcStack_580;
  undefined8 uStack_578;
  undefined1 auStack_568 [16];
  undefined1 auStack_558 [16];
  undefined1 auStack_548 [16];
  undefined1 auStack_538 [16];
  undefined1 auStack_528 [256];
  undefined1 auStack_428 [256];
  undefined1 auStack_328 [128];
  undefined1 auStack_2a8 [136];
  undefined1 *puStack_220;
  uv_fs_t *puStack_218;
  code *pcStack_210;
  undefined8 uStack_208;
  code *pcStack_1f8;
  undefined8 uStack_1f0;
  code *pcStack_1e0;
  code *pcStack_1d8;
  code *pcStack_1d0;
  uv_fs_t uStack_1c8;
  
  pcStack_1d0 = (code *)0x1572a7;
  loop = (uv_loop_t *)uv_default_loop();
  puVar5 = (uv_loop_t *)0x0;
  pcStack_1d0 = (code *)0x1572c7;
  uVar2 = uv_fs_open(0,&uStack_1c8,".",0,0,0);
  if ((int)uVar2 < 0) {
    pcStack_1d0 = (code *)0x157396;
    run_test_fs_open_dir_cold_1();
LAB_00157396:
    pcStack_1d0 = (code *)0x15739b;
    run_test_fs_open_dir_cold_2();
LAB_0015739b:
    pcStack_1d0 = (code *)0x1573a0;
    run_test_fs_open_dir_cold_3();
LAB_001573a0:
    pcStack_1d0 = (code *)0x1573a5;
    run_test_fs_open_dir_cold_4();
LAB_001573a5:
    pcStack_1d0 = (code *)0x1573aa;
    run_test_fs_open_dir_cold_5();
LAB_001573aa:
    pcStack_1d0 = (code *)0x1573af;
    run_test_fs_open_dir_cold_6();
LAB_001573af:
    pcStack_1d0 = (code *)0x1573b4;
    run_test_fs_open_dir_cold_7();
  }
  else {
    if (uStack_1c8.result < 0) goto LAB_00157396;
    if (uStack_1c8.ptr != (void *)0x0) goto LAB_0015739b;
    unaff_RBX = (ulong)uVar2;
    pcStack_1d0 = (code *)0x1572f4;
    uv_fs_req_cleanup();
    puVar5 = (uv_loop_t *)0x0;
    pcStack_1d0 = (code *)0x157302;
    iVar3 = uv_fs_close(0,&uStack_1c8,unaff_RBX,0);
    unaff_R14 = &uStack_1c8;
    if (iVar3 != 0) goto LAB_001573a0;
    pcStack_1d0 = (code *)0x15732c;
    puVar5 = loop;
    iVar3 = uv_fs_open(loop,&uStack_1c8,".",0,0,open_cb_simple);
    unaff_R14 = &uStack_1c8;
    if (iVar3 != 0) goto LAB_001573a5;
    unaff_R14 = &uStack_1c8;
    if (open_cb_count != 0) goto LAB_001573aa;
    pcStack_1d0 = (code *)0x157347;
    puVar5 = loop;
    uv_run(loop,0);
    unaff_R14 = &uStack_1c8;
    if (open_cb_count != 1) goto LAB_001573af;
    pcStack_1d0 = (code *)0x157355;
    unaff_RBX = uv_default_loop();
    pcStack_1d0 = (code *)0x157369;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_1d0 = (code *)0x157373;
    uv_run(unaff_RBX,0);
    pcStack_1d0 = (code *)0x157378;
    puVar5 = (uv_loop_t *)uv_default_loop();
    pcStack_1d0 = (code *)0x157380;
    iVar3 = uv_loop_close();
    unaff_R14 = &uStack_1c8;
    if (iVar3 == 0) {
      return 0;
    }
  }
  pcStack_1d0 = open_cb_simple;
  run_test_fs_open_dir_cold_8();
  if (puVar5->backend_fd == 1) {
    puVar6 = (uv_loop_t *)puVar5->watcher_queue[0];
    if ((long)puVar6 < 0) goto LAB_001573e1;
    open_cb_count = open_cb_count + 1;
    puVar6 = puVar5;
    if (puVar5->watchers != (uv__io_t **)0x0) {
      iVar3 = uv_fs_req_cleanup();
      return iVar3;
    }
  }
  else {
    pcStack_1d8 = (code *)0x1573e1;
    open_cb_simple_cold_1();
    puVar6 = extraout_RAX;
LAB_001573e1:
    pcStack_1d8 = (code *)0x1573e9;
    open_cb_simple_cold_3();
  }
  iVar3 = (int)puVar6;
  pcStack_1d8 = run_test_fs_file_open_append;
  open_cb_simple_cold_2();
  pcStack_1e0 = (code *)0x1573f4;
  pcStack_1d8 = (code *)unaff_RBX;
  fs_file_open_append(iVar3);
  pcStack_1e0 = (code *)0x1573f9;
  fs_file_open_append(iVar3);
  pcStack_1e0 = (code *)0x1573fe;
  uVar7 = uv_default_loop();
  pcStack_1e0 = (code *)0x157412;
  uv_walk(uVar7,close_walk_cb,0);
  pcStack_1e0 = (code *)0x15741c;
  uv_run(uVar7,0);
  pcStack_1e0 = (code *)0x157421;
  uVar8 = uv_default_loop();
  pcStack_1e0 = (code *)0x157429;
  iVar3 = uv_loop_close(uVar8);
  if (iVar3 == 0) {
    return 0;
  }
  pcStack_1e0 = fs_file_open_append;
  run_test_fs_file_open_append_cold_1();
  pcVar12 = "test_file";
  pcStack_1f8 = (code *)0x15744a;
  pcStack_1e0 = (code *)uVar7;
  unlink("test_file");
  pcStack_1f8 = (code *)0x15744f;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_1f8 = (code *)0x157475;
  iVar3 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar3 < 0) {
    pcStack_1f8 = (code *)0x15776a;
    fs_file_open_append_cold_1();
LAB_0015776a:
    pcStack_1f8 = (code *)0x15776f;
    fs_file_open_append_cold_2();
LAB_0015776f:
    pcStack_1f8 = (code *)0x157774;
    fs_file_open_append_cold_3();
LAB_00157774:
    pcStack_1f8 = (code *)0x157779;
    fs_file_open_append_cold_4();
LAB_00157779:
    pcStack_1f8 = (code *)0x15777e;
    fs_file_open_append_cold_5();
LAB_0015777e:
    pcStack_1f8 = (code *)0x157783;
    fs_file_open_append_cold_6();
LAB_00157783:
    pcStack_1f8 = (code *)0x157788;
    fs_file_open_append_cold_7();
LAB_00157788:
    pcStack_1f8 = (code *)0x15778d;
    fs_file_open_append_cold_8();
LAB_0015778d:
    pcStack_1f8 = (code *)0x157792;
    fs_file_open_append_cold_9();
LAB_00157792:
    pcStack_1f8 = (code *)0x157797;
    fs_file_open_append_cold_10();
LAB_00157797:
    pcStack_1f8 = (code *)0x15779c;
    fs_file_open_append_cold_11();
LAB_0015779c:
    pcStack_1f8 = (code *)0x1577a1;
    fs_file_open_append_cold_12();
LAB_001577a1:
    pcStack_1f8 = (code *)0x1577a6;
    fs_file_open_append_cold_13();
LAB_001577a6:
    pcStack_1f8 = (code *)0x1577ab;
    fs_file_open_append_cold_14();
LAB_001577ab:
    pcStack_1f8 = (code *)0x1577b0;
    fs_file_open_append_cold_15();
LAB_001577b0:
    pcStack_1f8 = (code *)0x1577b5;
    fs_file_open_append_cold_16();
LAB_001577b5:
    pcStack_1f8 = (code *)0x1577ba;
    fs_file_open_append_cold_17();
LAB_001577ba:
    pcStack_1f8 = (code *)0x1577bf;
    fs_file_open_append_cold_18();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015776a;
    pcStack_1f8 = (code *)0x157497;
    uv_fs_req_cleanup(&open_req1);
    pcStack_1f8 = (code *)0x1574a8;
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_1f0 = 0;
    pcStack_1f8 = (code *)0x1574e6;
    iVar3 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar3 < 0) goto LAB_0015776f;
    if (write_req.result < 0) goto LAB_00157774;
    pcStack_1f8 = (code *)0x157508;
    uv_fs_req_cleanup(&write_req);
    pcStack_1f8 = (code *)0x15751e;
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar3 != 0) goto LAB_00157779;
    if (close_req.result != 0) goto LAB_0015777e;
    pcStack_1f8 = (code *)0x157540;
    uv_fs_req_cleanup(&close_req);
    pcStack_1f8 = (code *)0x157560;
    iVar3 = uv_fs_open(0,&open_req1,"test_file",0x402,0,0);
    if (iVar3 < 0) goto LAB_00157783;
    if (open_req1.result._4_4_ < 0) goto LAB_00157788;
    pcStack_1f8 = (code *)0x157582;
    uv_fs_req_cleanup(&open_req1);
    pcStack_1f8 = (code *)0x157593;
    uVar21 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_1f0 = 0;
    pcStack_1f8 = (code *)0x1575d1;
    iov = uVar21;
    iVar3 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar3 < 0) goto LAB_0015778d;
    if (write_req.result < 0) goto LAB_00157792;
    pcStack_1f8 = (code *)0x1575f3;
    uv_fs_req_cleanup(&write_req);
    pcStack_1f8 = (code *)0x157609;
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar3 != 0) goto LAB_00157797;
    if (close_req.result != 0) goto LAB_0015779c;
    pcStack_1f8 = (code *)0x15762b;
    uv_fs_req_cleanup(&close_req);
    pcStack_1f8 = (code *)0x15764b;
    iVar3 = uv_fs_open(0,&open_req1,"test_file",0,0x100,0);
    if (iVar3 < 0) goto LAB_001577a1;
    if (open_req1.result._4_4_ < 0) goto LAB_001577a6;
    pcStack_1f8 = (code *)0x15766d;
    uv_fs_req_cleanup(&open_req1);
    pcStack_1f8 = (code *)0x15767e;
    uVar21 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_1f0 = 0;
    pcStack_1f8 = (code *)0x1576bc;
    iov = uVar21;
    uVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    pcVar12 = (char *)(ulong)uVar2;
    pcStack_1f8 = (code *)0x1576ce;
    printf("read = %d\n",(ulong)uVar2);
    if (uVar2 != 0x1a) goto LAB_001577ab;
    if (read_req.result != 0x1a) goto LAB_001577b0;
    auVar20[0] = -(buf[10] == 'r');
    auVar20[1] = -(buf[0xb] == '\n');
    auVar20[2] = -(buf[0xc] == '\0');
    auVar20[3] = -(buf[0xd] == 't');
    auVar20[4] = -(buf[0xe] == 'e');
    auVar20[5] = -(buf[0xf] == 's');
    auVar20[6] = -(buf[0x10] == 't');
    auVar20[7] = -(buf[0x11] == '-');
    auVar20[8] = -(buf[0x12] == 'b');
    auVar20[9] = -(buf[0x13] == 'u');
    auVar20[10] = -(buf[0x14] == 'f');
    auVar20[0xb] = -(buf[0x15] == 'f');
    auVar20[0xc] = -(buf[0x16] == 'e');
    auVar20[0xd] = -(buf[0x17] == 'r');
    auVar20[0xe] = -(buf[0x18] == '\n');
    auVar20[0xf] = -(buf[0x19] == '\0');
    auVar19[0] = -(buf[0] == 't');
    auVar19[1] = -(buf[1] == 'e');
    auVar19[2] = -(buf[2] == 's');
    auVar19[3] = -(buf[3] == 't');
    auVar19[4] = -(buf[4] == '-');
    auVar19[5] = -(buf[5] == 'b');
    auVar19[6] = -(buf[6] == 'u');
    auVar19[7] = -(buf[7] == 'f');
    auVar19[8] = -(buf[8] == 'f');
    auVar19[9] = -(buf[9] == 'e');
    auVar19[10] = -(buf[10] == 'r');
    auVar19[0xb] = -(buf[0xb] == '\n');
    auVar19[0xc] = -(buf[0xc] == '\0');
    auVar19[0xd] = -(buf[0xd] == 't');
    auVar19[0xe] = -(buf[0xe] == 'e');
    auVar19[0xf] = -(buf[0xf] == 's');
    auVar19 = auVar19 & auVar20;
    if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) != 0xffff) goto LAB_001577b5;
    pcStack_1f8 = (code *)0x157724;
    uv_fs_req_cleanup(&read_req);
    pcStack_1f8 = (code *)0x15773a;
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar3 != 0) goto LAB_001577ba;
    if (close_req.result == 0) {
      pcStack_1f8 = (code *)0x157754;
      uv_fs_req_cleanup(&close_req);
      iVar3 = unlink("test_file");
      return iVar3;
    }
  }
  pcStack_1f8 = run_test_fs_rename_to_existing_file;
  fs_file_open_append_cold_19();
  pcVar13 = "test_file";
  pcStack_210 = (code *)0x1577d8;
  pcStack_1f8 = (code *)pcVar12;
  unlink("test_file");
  pcStack_210 = (code *)0x1577e4;
  unlink("test_file2");
  pcStack_210 = (code *)0x1577e9;
  loop = (uv_loop_t *)uv_default_loop();
  iVar4 = 0;
  pcStack_210 = (code *)0x15780f;
  iVar3 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar3 < 0) {
    pcStack_210 = (code *)0x157b05;
    run_test_fs_rename_to_existing_file_cold_1();
LAB_00157b05:
    pcStack_210 = (code *)0x157b0a;
    run_test_fs_rename_to_existing_file_cold_2();
LAB_00157b0a:
    pcStack_210 = (code *)0x157b0f;
    run_test_fs_rename_to_existing_file_cold_3();
LAB_00157b0f:
    pcStack_210 = (code *)0x157b14;
    run_test_fs_rename_to_existing_file_cold_4();
LAB_00157b14:
    pcStack_210 = (code *)0x157b19;
    run_test_fs_rename_to_existing_file_cold_5();
LAB_00157b19:
    pcStack_210 = (code *)0x157b1e;
    run_test_fs_rename_to_existing_file_cold_6();
LAB_00157b1e:
    pcStack_210 = (code *)0x157b23;
    run_test_fs_rename_to_existing_file_cold_7();
LAB_00157b23:
    pcStack_210 = (code *)0x157b28;
    run_test_fs_rename_to_existing_file_cold_8();
LAB_00157b28:
    pcStack_210 = (code *)0x157b2d;
    run_test_fs_rename_to_existing_file_cold_9();
LAB_00157b2d:
    pcStack_210 = (code *)0x157b32;
    run_test_fs_rename_to_existing_file_cold_10();
LAB_00157b32:
    pcStack_210 = (code *)0x157b37;
    run_test_fs_rename_to_existing_file_cold_11();
LAB_00157b37:
    pcStack_210 = (code *)0x157b3c;
    run_test_fs_rename_to_existing_file_cold_12();
LAB_00157b3c:
    pcStack_210 = (code *)0x157b41;
    run_test_fs_rename_to_existing_file_cold_13();
LAB_00157b41:
    pcStack_210 = (code *)0x157b46;
    run_test_fs_rename_to_existing_file_cold_14();
LAB_00157b46:
    pcStack_210 = (code *)0x157b4b;
    run_test_fs_rename_to_existing_file_cold_15();
LAB_00157b4b:
    pcStack_210 = (code *)0x157b50;
    run_test_fs_rename_to_existing_file_cold_16();
LAB_00157b50:
    pcStack_210 = (code *)0x157b55;
    run_test_fs_rename_to_existing_file_cold_17();
LAB_00157b55:
    pcStack_210 = (code *)0x157b5a;
    run_test_fs_rename_to_existing_file_cold_18();
LAB_00157b5a:
    pcStack_210 = (code *)0x157b5f;
    run_test_fs_rename_to_existing_file_cold_19();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00157b05;
    pcStack_210 = (code *)0x157831;
    uv_fs_req_cleanup(&open_req1);
    pcStack_210 = (code *)0x157842;
    uVar21 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_208 = 0;
    iVar4 = 0;
    pcStack_210 = (code *)0x157880;
    iov = uVar21;
    iVar3 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar3 < 0) goto LAB_00157b0a;
    if (write_req.result < 0) goto LAB_00157b0f;
    pcStack_210 = (code *)0x1578a2;
    uv_fs_req_cleanup();
    iVar4 = 0;
    pcStack_210 = (code *)0x1578b8;
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar3 != 0) goto LAB_00157b14;
    if (close_req.result != 0) goto LAB_00157b19;
    pcStack_210 = (code *)0x1578da;
    uv_fs_req_cleanup();
    iVar4 = 0;
    pcStack_210 = (code *)0x1578fd;
    iVar3 = uv_fs_open(0,&open_req1,"test_file2",0x41,0x180,0);
    if (iVar3 < 0) goto LAB_00157b1e;
    if (open_req1.result._4_4_ < 0) goto LAB_00157b23;
    pcStack_210 = (code *)0x15791f;
    uv_fs_req_cleanup();
    iVar4 = 0;
    pcStack_210 = (code *)0x157935;
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar3 != 0) goto LAB_00157b28;
    if (close_req.result != 0) goto LAB_00157b2d;
    pcStack_210 = (code *)0x157957;
    uv_fs_req_cleanup();
    iVar4 = 0;
    pcStack_210 = (code *)0x157976;
    iVar3 = uv_fs_rename(0,&rename_req,"test_file","test_file2",0);
    if (iVar3 != 0) goto LAB_00157b32;
    if (rename_req.result != 0) goto LAB_00157b37;
    pcStack_210 = (code *)0x157998;
    uv_fs_req_cleanup();
    iVar4 = 0;
    pcStack_210 = (code *)0x1579b5;
    iVar3 = uv_fs_open(0,&open_req1,"test_file2",0,0,0);
    if (iVar3 < 0) goto LAB_00157b3c;
    if (open_req1.result._4_4_ < 0) goto LAB_00157b41;
    pcStack_210 = (code *)0x1579d7;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_210 = (code *)0x1579f9;
    uVar21 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_208 = 0;
    iVar4 = 0;
    pcStack_210 = (code *)0x157a37;
    iov = uVar21;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar3 < 0) goto LAB_00157b46;
    if (read_req.result < 0) goto LAB_00157b4b;
    iVar4 = 0x2e3070;
    pcStack_210 = (code *)0x157a60;
    iVar3 = strcmp(buf,test_buf);
    if (iVar3 != 0) goto LAB_00157b50;
    pcStack_210 = (code *)0x157a74;
    uv_fs_req_cleanup();
    iVar4 = 0;
    pcStack_210 = (code *)0x157a8a;
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar3 != 0) goto LAB_00157b55;
    if (close_req.result != 0) goto LAB_00157b5a;
    pcStack_210 = (code *)0x157aac;
    uv_fs_req_cleanup(&close_req);
    pcStack_210 = (code *)0x157ab8;
    unlink("test_file");
    pcStack_210 = (code *)0x157ac4;
    unlink("test_file2");
    pcStack_210 = (code *)0x157ac9;
    pcVar13 = (char *)uv_default_loop();
    pcStack_210 = (code *)0x157add;
    uv_walk(pcVar13,close_walk_cb,0);
    pcStack_210 = (code *)0x157ae7;
    uv_run(pcVar13,0);
    pcStack_210 = (code *)0x157aec;
    iVar4 = uv_default_loop();
    pcStack_210 = (code *)0x157af4;
    iVar3 = uv_loop_close();
    if (iVar3 == 0) {
      return 0;
    }
  }
  pcStack_210 = run_test_fs_read_bufs;
  run_test_fs_rename_to_existing_file_cold_20();
  puStack_218 = (uv_fs_t *)0x157b6a;
  pcStack_210 = (code *)pcVar13;
  fs_read_bufs(iVar4);
  puStack_218 = (uv_fs_t *)0x157b6f;
  fs_read_bufs(iVar4);
  puStack_218 = (uv_fs_t *)0x157b74;
  __s1 = (undefined1 *)uv_default_loop();
  puStack_218 = (uv_fs_t *)0x157b88;
  uv_walk(__s1,close_walk_cb,0);
  puStack_218 = (uv_fs_t *)0x157b92;
  uv_run(__s1,0);
  puStack_218 = (uv_fs_t *)0x157b97;
  uv_default_loop();
  puStack_218 = (uv_fs_t *)0x157b9f;
  iVar3 = uv_loop_close();
  if (iVar3 == 0) {
    return 0;
  }
  puStack_218 = (uv_fs_t *)fs_read_bufs;
  run_test_fs_read_bufs_cold_1();
  iVar4 = 0;
  pcStack_580 = (code *)0x157bd3;
  puStack_220 = __s1;
  puStack_218 = unaff_R14;
  iVar3 = uv_fs_open(0,&open_req1,"test/fixtures/lorem_ipsum.txt",0,0,0);
  if (iVar3 < 0) {
    pcStack_580 = (code *)0x157e0b;
    fs_read_bufs_cold_1();
LAB_00157e0b:
    pcStack_580 = (code *)0x157e10;
    fs_read_bufs_cold_2();
LAB_00157e10:
    pcStack_580 = (code *)0x157e15;
    fs_read_bufs_cold_3();
LAB_00157e15:
    pcStack_580 = (code *)0x157e1a;
    fs_read_bufs_cold_4();
LAB_00157e1a:
    pcStack_580 = (code *)0x157e1f;
    fs_read_bufs_cold_5();
LAB_00157e1f:
    pcStack_580 = (code *)0x157e24;
    fs_read_bufs_cold_6();
LAB_00157e24:
    pcStack_580 = (code *)0x157e29;
    fs_read_bufs_cold_7();
LAB_00157e29:
    pcStack_580 = (code *)0x157e2e;
    fs_read_bufs_cold_8();
LAB_00157e2e:
    pcStack_580 = (code *)0x157e33;
    fs_read_bufs_cold_9();
LAB_00157e33:
    pcStack_580 = (code *)0x157e38;
    fs_read_bufs_cold_10();
LAB_00157e38:
    pcStack_580 = (code *)0x157e3d;
    fs_read_bufs_cold_11();
LAB_00157e3d:
    pcStack_580 = (code *)0x157e42;
    fs_read_bufs_cold_12();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00157e0b;
    pcStack_580 = (code *)0x157bf5;
    uv_fs_req_cleanup();
    uStack_578 = 0;
    iVar4 = 0;
    pcStack_580 = (code *)0x157c19;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,0,0,0);
    if (iVar3 != -0x16) goto LAB_00157e10;
    uStack_578 = 0;
    iVar4 = 0;
    pcStack_580 = (code *)0x157c49;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,0,1,0);
    if (iVar3 != -0x16) goto LAB_00157e15;
    uStack_578 = 0;
    iVar4 = 0;
    pcStack_580 = (code *)0x157c79;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_568,0,0);
    if (iVar3 != -0x16) goto LAB_00157e1a;
    pcStack_580 = (code *)0x157c91;
    auStack_568 = uv_buf_init(auStack_528,0x100);
    __s1 = auStack_568;
    pcStack_580 = (code *)0x157caf;
    auStack_558 = uv_buf_init(auStack_428,0x100);
    pcStack_580 = (code *)0x157cc9;
    auStack_548 = uv_buf_init(auStack_328,0x80);
    pcStack_580 = (code *)0x157ce3;
    auStack_538 = uv_buf_init(auStack_2a8,0x80);
    uStack_578 = 0;
    iVar4 = 0;
    pcStack_580 = (code *)0x157d13;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,__s1,2,0);
    if (iVar3 != 0x1be) goto LAB_00157e1f;
    if (read_req.result != 0x1be) goto LAB_00157e24;
    __s1 = auStack_548;
    unaff_R14 = &read_req;
    pcStack_580 = (code *)0x157d43;
    uv_fs_req_cleanup();
    uStack_578 = 0;
    iVar4 = 0;
    pcStack_580 = (code *)0x157d6a;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,__s1,2,0x100);
    if (iVar3 != 0xbe) goto LAB_00157e29;
    if (read_req.result != 0xbe) goto LAB_00157e2e;
    pcStack_580 = (code *)0x157d92;
    uv_fs_req_cleanup(&read_req);
    __s1 = (undefined1 *)auStack_558._0_8_;
    pcStack_580 = (code *)0x157da9;
    puVar15 = (undefined1 *)auStack_558._0_8_;
    iVar3 = bcmp((void *)auStack_558._0_8_,(void *)auStack_548._0_8_,0x80);
    iVar4 = (int)puVar15;
    if (iVar3 != 0) goto LAB_00157e33;
    __s1 = __s1 + 0x80;
    pcStack_580 = (code *)0x157dc7;
    puVar15 = __s1;
    iVar3 = bcmp(__s1,(void *)auStack_538._0_8_,0x3e);
    iVar4 = (int)puVar15;
    if (iVar3 != 0) goto LAB_00157e38;
    iVar4 = 0;
    pcStack_580 = (code *)0x157de1;
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar3 != 0) goto LAB_00157e3d;
    if (close_req.result == 0) {
      pcStack_580 = (code *)0x157dfb;
      iVar3 = uv_fs_req_cleanup(&close_req);
      return iVar3;
    }
  }
  pcStack_580 = run_test_fs_read_file_eof;
  fs_read_bufs_cold_13();
  pcStack_588 = (code *)0x157e4d;
  pcStack_580 = (code *)__s1;
  fs_read_file_eof(iVar4);
  pcStack_588 = (code *)0x157e52;
  fs_read_file_eof(iVar4);
  pcStack_588 = (code *)0x157e57;
  uVar7 = uv_default_loop();
  pcStack_588 = (code *)0x157e6b;
  uv_walk(uVar7,close_walk_cb,0);
  pcStack_588 = (code *)0x157e75;
  uv_run(uVar7,0);
  pcStack_588 = (code *)0x157e7a;
  uVar8 = uv_default_loop();
  pcStack_588 = (code *)0x157e82;
  iVar3 = uv_loop_close(uVar8);
  if (iVar3 == 0) {
    return 0;
  }
  pcStack_588 = fs_read_file_eof;
  run_test_fs_read_file_eof_cold_1();
  puVar14 = (uv_fs_t *)0x184395;
  puStack_5a0 = (uv_fs_t *)0x157ea3;
  pcStack_588 = (code *)uVar7;
  unlink("test_file");
  puStack_5a0 = (uv_fs_t *)0x157ea8;
  loop = (uv_loop_t *)uv_default_loop();
  iVar4 = 0;
  puStack_5a0 = (uv_fs_t *)0x157ece;
  iVar3 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar3 < 0) {
    puStack_5a0 = (uv_fs_t *)0x15812b;
    fs_read_file_eof_cold_1();
LAB_0015812b:
    puStack_5a0 = (uv_fs_t *)0x158130;
    fs_read_file_eof_cold_2();
LAB_00158130:
    puStack_5a0 = (uv_fs_t *)0x158135;
    fs_read_file_eof_cold_3();
LAB_00158135:
    puStack_5a0 = (uv_fs_t *)0x15813a;
    fs_read_file_eof_cold_4();
LAB_0015813a:
    puStack_5a0 = (uv_fs_t *)0x15813f;
    fs_read_file_eof_cold_5();
LAB_0015813f:
    puStack_5a0 = (uv_fs_t *)0x158144;
    fs_read_file_eof_cold_6();
LAB_00158144:
    puStack_5a0 = (uv_fs_t *)0x158149;
    fs_read_file_eof_cold_7();
LAB_00158149:
    puStack_5a0 = (uv_fs_t *)0x15814e;
    fs_read_file_eof_cold_8();
LAB_0015814e:
    puStack_5a0 = (uv_fs_t *)0x158153;
    fs_read_file_eof_cold_9();
LAB_00158153:
    puStack_5a0 = (uv_fs_t *)0x158158;
    fs_read_file_eof_cold_10();
LAB_00158158:
    puStack_5a0 = (uv_fs_t *)0x15815d;
    fs_read_file_eof_cold_11();
LAB_0015815d:
    puStack_5a0 = (uv_fs_t *)0x158162;
    fs_read_file_eof_cold_12();
LAB_00158162:
    puStack_5a0 = (uv_fs_t *)0x158167;
    fs_read_file_eof_cold_13();
LAB_00158167:
    puStack_5a0 = (uv_fs_t *)0x15816c;
    fs_read_file_eof_cold_14();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015812b;
    puStack_5a0 = (uv_fs_t *)0x157ef0;
    uv_fs_req_cleanup(&open_req1);
    puStack_5a0 = (uv_fs_t *)0x157f01;
    uVar21 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_598 = 0;
    iVar4 = 0;
    puStack_5a0 = (uv_fs_t *)0x157f3f;
    iov = uVar21;
    iVar3 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar3 < 0) goto LAB_00158130;
    if (write_req.result < 0) goto LAB_00158135;
    puStack_5a0 = (uv_fs_t *)0x157f61;
    uv_fs_req_cleanup();
    iVar4 = 0;
    puStack_5a0 = (uv_fs_t *)0x157f77;
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar3 != 0) goto LAB_0015813a;
    if (close_req.result != 0) goto LAB_0015813f;
    puStack_5a0 = (uv_fs_t *)0x157f99;
    uv_fs_req_cleanup();
    iVar4 = 0;
    puStack_5a0 = (uv_fs_t *)0x157fb6;
    iVar3 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar3 < 0) goto LAB_00158144;
    if (open_req1.result._4_4_ < 0) goto LAB_00158149;
    puStack_5a0 = (uv_fs_t *)0x157fd8;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    puStack_5a0 = (uv_fs_t *)0x157ffa;
    uVar21 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_598 = 0;
    iVar4 = 0;
    puStack_5a0 = (uv_fs_t *)0x158038;
    iov = uVar21;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar3 < 0) goto LAB_0015814e;
    if (read_req.result < 0) goto LAB_00158153;
    iVar4 = 0x2e3070;
    puStack_5a0 = (uv_fs_t *)0x158061;
    iVar3 = strcmp(buf,test_buf);
    if (iVar3 != 0) goto LAB_00158158;
    puVar14 = &read_req;
    puStack_5a0 = (uv_fs_t *)0x158078;
    uv_fs_req_cleanup(&read_req);
    puStack_5a0 = (uv_fs_t *)0x158089;
    uVar21 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_598 = 0;
    iVar4 = 0;
    puStack_5a0 = (uv_fs_t *)0x1580c3;
    iov = uVar21;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,read_req.result);
    if (iVar3 != 0) goto LAB_0015815d;
    if (read_req.result != 0) goto LAB_00158162;
    puStack_5a0 = (uv_fs_t *)0x1580e5;
    uv_fs_req_cleanup();
    iVar4 = 0;
    puStack_5a0 = (uv_fs_t *)0x1580fb;
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar3 != 0) goto LAB_00158167;
    if (close_req.result == 0) {
      puStack_5a0 = (uv_fs_t *)0x158115;
      uv_fs_req_cleanup(&close_req);
      iVar3 = unlink("test_file");
      return iVar3;
    }
  }
  puStack_5a0 = (uv_fs_t *)run_test_fs_write_multiple_bufs;
  fs_read_file_eof_cold_15();
  puStack_5a8 = (uv_fs_t *)0x158177;
  puStack_5a0 = puVar14;
  fs_write_multiple_bufs(iVar4);
  puStack_5a8 = (uv_fs_t *)0x15817c;
  fs_write_multiple_bufs(iVar4);
  puStack_5a8 = (uv_fs_t *)0x158181;
  uVar7 = uv_default_loop();
  puStack_5a8 = (uv_fs_t *)0x158195;
  uv_walk(uVar7,close_walk_cb,0);
  puStack_5a8 = (uv_fs_t *)0x15819f;
  uv_run(uVar7,0);
  puStack_5a8 = (uv_fs_t *)0x1581a4;
  uVar8 = uv_default_loop();
  puStack_5a8 = (uv_fs_t *)0x1581ac;
  iVar3 = uv_loop_close(uVar8);
  if (iVar3 == 0) {
    return 0;
  }
  puStack_5a8 = (uv_fs_t *)fs_write_multiple_bufs;
  run_test_fs_write_multiple_bufs_cold_1();
  uStack_5b0 = uVar7;
  puStack_5a8 = unaff_R14;
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar3 = 0;
  iVar4 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar4 < 0) {
    fs_write_multiple_bufs_cold_1();
LAB_0015864c:
    fs_write_multiple_bufs_cold_2();
LAB_00158651:
    fs_write_multiple_bufs_cold_3();
LAB_00158656:
    fs_write_multiple_bufs_cold_4();
LAB_0015865b:
    fs_write_multiple_bufs_cold_5();
LAB_00158660:
    fs_write_multiple_bufs_cold_6();
LAB_00158665:
    fs_write_multiple_bufs_cold_7();
LAB_0015866a:
    fs_write_multiple_bufs_cold_8();
LAB_0015866f:
    fs_write_multiple_bufs_cold_9();
LAB_00158674:
    fs_write_multiple_bufs_cold_10();
LAB_00158679:
    fs_write_multiple_bufs_cold_11();
LAB_0015867e:
    fs_write_multiple_bufs_cold_12();
LAB_00158683:
    fs_write_multiple_bufs_cold_13();
LAB_00158688:
    fs_write_multiple_bufs_cold_14();
LAB_0015868d:
    fs_write_multiple_bufs_cold_15();
LAB_00158692:
    fs_write_multiple_bufs_cold_16();
LAB_00158697:
    fs_write_multiple_bufs_cold_19();
LAB_0015869c:
    fs_write_multiple_bufs_cold_20();
LAB_001586a1:
    fs_write_multiple_bufs_cold_21();
LAB_001586a6:
    fs_write_multiple_bufs_cold_22();
LAB_001586ab:
    fs_write_multiple_bufs_cold_23();
LAB_001586b0:
    fs_write_multiple_bufs_cold_24();
LAB_001586b5:
    fs_write_multiple_bufs_cold_25();
LAB_001586ba:
    fs_write_multiple_bufs_cold_17();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015864c;
    uv_fs_req_cleanup(&open_req1);
    auStack_5d8 = uv_buf_init(test_buf,0xd);
    auStack_5c8 = uv_buf_init(test_buf2,0xf);
    iVar3 = 0;
    iVar4 = uv_fs_write(0,&write_req,(int)open_req1.result,auStack_5d8,2,0);
    if (iVar4 < 0) goto LAB_00158651;
    if (write_req.result < 0) goto LAB_00158656;
    uv_fs_req_cleanup();
    iVar3 = 0;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar4 != 0) goto LAB_0015865b;
    if (close_req.result != 0) goto LAB_00158660;
    uv_fs_req_cleanup();
    iVar3 = 0;
    iVar4 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar4 < 0) goto LAB_00158665;
    if (open_req1.result._4_4_ < 0) goto LAB_0015866a;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf2[0] = '\0';
    buf2[1] = '\0';
    buf2[2] = '\0';
    buf2[3] = '\0';
    buf2[4] = '\0';
    buf2[5] = '\0';
    buf2[6] = '\0';
    buf2[7] = '\0';
    buf2[8] = '\0';
    buf2[9] = '\0';
    buf2[10] = '\0';
    buf2[0xb] = '\0';
    buf2[0xc] = '\0';
    buf2[0xd] = '\0';
    buf2[0xe] = '\0';
    buf2[0xf] = '\0';
    buf2[0x10] = '\0';
    buf2[0x11] = '\0';
    buf2[0x12] = '\0';
    buf2[0x13] = '\0';
    buf2[0x14] = '\0';
    buf2[0x15] = '\0';
    buf2[0x16] = '\0';
    buf2[0x17] = '\0';
    buf2[0x18] = '\0';
    buf2[0x19] = '\0';
    buf2[0x1a] = '\0';
    buf2[0x1b] = '\0';
    buf2[0x1c] = '\0';
    buf2[0x1d] = '\0';
    buf2[0x1e] = '\0';
    buf2[0x1f] = '\0';
    auVar19 = uv_buf_init(buf,0xd);
    auStack_5d8 = auVar19;
    auVar19 = uv_buf_init(buf2);
    iVar3 = (int)open_req1.result;
    auStack_5c8 = auVar19;
    _Var9 = lseek64((int)open_req1.result,0,1);
    if (_Var9 != 0) goto LAB_0015866f;
    iVar3 = 0;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_5d8,2,0xffffffffffffffff);
    if (iVar4 < 0) goto LAB_00158674;
    if (read_req.result != 0x1c) goto LAB_00158679;
    iVar3 = 0x2e3070;
    iVar4 = strcmp(buf,test_buf);
    if (iVar4 != 0) goto LAB_0015867e;
    iVar3 = 0x2e4460;
    iVar4 = strcmp(buf2,test_buf2);
    if (iVar4 != 0) goto LAB_00158683;
    uv_fs_req_cleanup(&read_req);
    uVar21 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar3 = 0;
    iov = uVar21;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar4 != 0) goto LAB_00158688;
    if (read_req.result != 0) goto LAB_0015868d;
    uv_fs_req_cleanup(&read_req);
    auVar19 = uv_buf_init(buf,0xd);
    auStack_5d8 = auVar19;
    auVar19 = uv_buf_init(buf2,0xf);
    iVar3 = 0;
    auStack_5c8 = auVar19;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_5d8,2,0);
    if (iVar4 < 0) goto LAB_00158692;
    if (read_req.result == 0x1c) {
LAB_0015854a:
      iVar3 = 0x2e3070;
      iVar4 = strcmp(buf,test_buf);
      if (iVar4 != 0) goto LAB_00158697;
      iVar3 = 0x2e4460;
      iVar4 = strcmp(buf2,test_buf2);
      if (iVar4 != 0) goto LAB_0015869c;
      uv_fs_req_cleanup(&read_req);
      uVar21 = (uv_buf_t)uv_buf_init(buf,0x20);
      iVar3 = 0;
      iov = uVar21;
      iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0x1c);
      if (iVar4 != 0) goto LAB_001586a1;
      if (read_req.result != 0) goto LAB_001586a6;
      uv_fs_req_cleanup();
      iVar3 = 0;
      iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
      if (iVar4 != 0) goto LAB_001586ab;
      if (close_req.result == 0) {
        uv_fs_req_cleanup(&close_req);
        iVar3 = unlink("test_file");
        return iVar3;
      }
      goto LAB_001586b0;
    }
    if (read_req.result != 0xd) goto LAB_001586b5;
    uv_fs_req_cleanup();
    iVar3 = 0;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_5c8,1,read_req.result);
    if (iVar4 < 0) goto LAB_001586ba;
    if (read_req.result == 0xf) goto LAB_0015854a;
  }
  fs_write_multiple_bufs_cold_18();
  fs_write_alotof_bufs(iVar3);
  fs_write_alotof_bufs(iVar3);
  uVar7 = uv_default_loop();
  uv_walk(uVar7,close_walk_cb,0);
  uv_run(uVar7,0);
  uVar7 = uv_default_loop();
  iVar3 = uv_loop_close(uVar7);
  if (iVar3 == 0) {
    return 0;
  }
  run_test_fs_write_alotof_bufs_cold_1();
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar3 = 0xd4310;
  pvVar10 = malloc(0xd4310);
  if (pvVar10 == (void *)0x0) {
LAB_00158a3c:
    fs_write_alotof_bufs_cold_18();
LAB_00158a41:
    fs_write_alotof_bufs_cold_1();
LAB_00158a46:
    fs_write_alotof_bufs_cold_2();
LAB_00158a4b:
    fs_write_alotof_bufs_cold_3();
LAB_00158a50:
    fs_write_alotof_bufs_cold_4();
LAB_00158a55:
    fs_write_alotof_bufs_cold_17();
LAB_00158a5a:
    fs_write_alotof_bufs_cold_5();
LAB_00158a5f:
    fs_write_alotof_bufs_cold_6();
LAB_00158a64:
    fs_write_alotof_bufs_cold_7();
LAB_00158a69:
    fs_write_alotof_bufs_cold_8();
LAB_00158a6e:
    fs_write_alotof_bufs_cold_9();
LAB_00158a73:
    fs_write_alotof_bufs_cold_10();
LAB_00158a78:
    fs_write_alotof_bufs_cold_12();
LAB_00158a7d:
    fs_write_alotof_bufs_cold_13();
LAB_00158a82:
    fs_write_alotof_bufs_cold_14();
LAB_00158a87:
    fs_write_alotof_bufs_cold_15();
  }
  else {
    iVar3 = 0;
    iVar4 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar4 < 0) goto LAB_00158a41;
    if (open_req1.result._4_4_ < 0) goto LAB_00158a46;
    uv_fs_req_cleanup(&open_req1);
    lVar17 = 8;
    do {
      auVar19 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar10 + lVar17 + -8) = auVar19._0_8_;
      *(long *)((long)pvVar10 + lVar17) = auVar19._8_8_;
      lVar17 = lVar17 + 0x10;
    } while (lVar17 != 0xd4318);
    iVar3 = 0;
    iVar4 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar10,0xd431,0xffffffffffffffff);
    if (iVar4 < 0) goto LAB_00158a4b;
    if (write_req.result != 0xac67d) goto LAB_00158a50;
    uv_fs_req_cleanup(&write_req);
    iVar3 = 0xac67d;
    pvVar11 = malloc(0xac67d);
    if (pvVar11 == (void *)0x0) goto LAB_00158a55;
    lVar17 = 8;
    pvVar18 = pvVar11;
    do {
      auVar19 = uv_buf_init(pvVar18,0xd);
      *(long *)((long)pvVar10 + lVar17 + -8) = auVar19._0_8_;
      *(long *)((long)pvVar10 + lVar17) = auVar19._8_8_;
      lVar17 = lVar17 + 0x10;
      pvVar18 = (void *)((long)pvVar18 + 0xd);
    } while (lVar17 != 0xd4318);
    iVar3 = 0;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    unaff_R12 = 0xd4318;
    if (iVar4 != 0) goto LAB_00158a5a;
    if (close_req.result != 0) goto LAB_00158a5f;
    uv_fs_req_cleanup();
    iVar3 = 0;
    iVar4 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar4 < 0) goto LAB_00158a64;
    if (open_req1.result._4_4_ < 0) goto LAB_00158a69;
    uv_fs_req_cleanup();
    iVar3 = 0;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar10,0xd431,0xffffffffffffffff);
    if (iVar4 < 0) goto LAB_00158a6e;
    if (read_req.result != 0x3400) goto LAB_00158a73;
    unaff_R12 = 0;
    do {
      pcVar12 = (char *)((long)pvVar11 + unaff_R12);
      iVar4 = strncmp(pcVar12,test_buf,0xd);
      iVar3 = (int)pcVar12;
      if (iVar4 != 0) {
        fs_write_alotof_bufs_cold_11();
        goto LAB_00158a3c;
      }
      unaff_R12 = unaff_R12 + 0xd;
    } while (unaff_R12 != 0x3400);
    uv_fs_req_cleanup(&read_req);
    free(pvVar11);
    iVar3 = (int)open_req1.result;
    _Var9 = lseek64((int)open_req1.result,write_req.result,0);
    if (_Var9 != write_req.result) goto LAB_00158a78;
    uVar21 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar3 = 0;
    iov = uVar21;
    iVar4 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar4 != 0) goto LAB_00158a7d;
    if (read_req.result != 0) goto LAB_00158a82;
    uv_fs_req_cleanup();
    iVar3 = 0;
    iVar4 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar4 != 0) goto LAB_00158a87;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      free(pvVar10);
      return extraout_EAX;
    }
  }
  fs_write_alotof_bufs_cold_16();
  fs_write_alotof_bufs_with_offset(iVar3);
  fs_write_alotof_bufs_with_offset(iVar3);
  pvVar10 = (void *)uv_default_loop();
  uv_walk(pvVar10,close_walk_cb,0);
  uv_run(pvVar10,0);
  uVar7 = uv_default_loop();
  iVar3 = uv_loop_close(uVar7);
  if (iVar3 == 0) {
    return 0;
  }
  run_test_fs_write_alotof_bufs_with_offset_cold_1();
  pcStack_660 = (code *)0x158af0;
  uStack_658 = extraout_RAX_00;
  pvStack_650 = pvVar10;
  lStack_648 = unaff_R12;
  unlink("test_file");
  pcStack_660 = (code *)0x158af5;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_660 = (code *)0x158b06;
  pvVar11 = malloc(0xd4310);
  if (pvVar11 == (void *)0x0) {
LAB_00158e4b:
    pvVar11 = pvVar10;
    pcStack_660 = (code *)0x158e50;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_00158e50:
    pcStack_660 = (code *)0x158e55;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_00158e55:
    pcStack_660 = (code *)0x158e5a;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_00158e5a:
    pcStack_660 = (code *)0x158e5f;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_00158e5f:
    pcStack_660 = (code *)0x158e64;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_00158e64:
    pcStack_660 = (code *)0x158e69;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_00158e69:
    pcStack_660 = (code *)0x158e6e;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_00158e6e:
    pcStack_660 = (code *)0x158e73;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_00158e73:
    pcStack_660 = (code *)0x158e78;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_00158e78:
    pcStack_660 = (code *)0x158e7d;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_00158e7d:
    pcStack_660 = (code *)0x158e82;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_00158e82:
    pcStack_660 = (code *)0x158e87;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_00158e87:
    pcStack_660 = (code *)0x158e8c;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_00158e8c:
    pcStack_660 = (code *)0x158e91;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_00158e91:
    pcStack_660 = (code *)0x158e96;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    pcStack_660 = (code *)0x158b35;
    iVar3 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar3 < 0) goto LAB_00158e50;
    if (open_req1.result._4_4_ < 0) goto LAB_00158e55;
    pcStack_660 = (code *)0x158b57;
    uv_fs_req_cleanup(&open_req1);
    pcStack_660 = (code *)0x158b68;
    uVar21 = (uv_buf_t)uv_buf_init("0123456789",10);
    uStack_658 = 0;
    pcStack_660 = (code *)0x158ba6;
    iov = uVar21;
    iVar3 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar3 != 10) goto LAB_00158e5a;
    if (write_req.result != 10) goto LAB_00158e5f;
    pcStack_660 = (code *)0x158bc9;
    uv_fs_req_cleanup(&write_req);
    lVar17 = 8;
    do {
      pcStack_660 = (code *)0x158be3;
      auVar19 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar11 + lVar17 + -8) = auVar19._0_8_;
      *(long *)((long)pvVar11 + lVar17) = auVar19._8_8_;
      lVar17 = lVar17 + 0x10;
    } while (lVar17 != 0xd4318);
    uStack_658 = 0;
    pcStack_660 = (code *)0x158c24;
    iVar3 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar11,0xd431,10);
    if (iVar3 < 0) goto LAB_00158e64;
    if (write_req.result != 0xac67d) goto LAB_00158e69;
    pcStack_660 = (code *)0x158c49;
    uv_fs_req_cleanup(&write_req);
    pcStack_660 = (code *)0x158c53;
    pcVar12 = (char *)malloc(0xac67d);
    if (pcVar12 == (char *)0x0) goto LAB_00158e6e;
    lVar17 = 8;
    pcVar13 = pcVar12;
    do {
      pcStack_660 = (code *)0x158c75;
      auVar19 = uv_buf_init(pcVar13,0xd);
      *(long *)((long)pvVar11 + lVar17 + -8) = auVar19._0_8_;
      *(long *)((long)pvVar11 + lVar17) = auVar19._8_8_;
      lVar17 = lVar17 + 0x10;
      pcVar13 = pcVar13 + 0xd;
    } while (lVar17 != 0xd4318);
    uStack_658 = 0;
    pcStack_660 = (code *)0x158cba;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar11,0xd431,10);
    if (iVar3 < 0) goto LAB_00158e73;
    lVar17 = 0xd;
    if (iVar3 != 0xd) {
      lVar17 = 0x3400;
    }
    if (read_req.result != lVar17) goto LAB_00158e78;
    pcVar13 = pcVar12;
    uVar16 = 0;
    do {
      pcStack_660 = (code *)0x158cff;
      iVar4 = strncmp(pcVar13,test_buf,0xd);
      if (iVar4 != 0) {
        pcStack_660 = (code *)0x158e4b;
        fs_write_alotof_bufs_with_offset_cold_9();
        pvVar10 = pvVar11;
        goto LAB_00158e4b;
      }
      if (iVar3 == 0xd) break;
      pcVar13 = pcVar13 + 0xd;
      bVar1 = uVar16 < 0x3ff;
      uVar16 = uVar16 + 1;
    } while (bVar1);
    pcStack_660 = (code *)0x158d2c;
    uv_fs_req_cleanup(&read_req);
    pcStack_660 = (code *)0x158d34;
    free(pcVar12);
    pcStack_660 = (code *)0x158d4b;
    iVar3 = uv_fs_stat(0,&stat_req,"test_file",0);
    if (iVar3 != 0) goto LAB_00158e7d;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + 10) goto LAB_00158e82;
    pcStack_660 = (code *)0x158d7b;
    uv_fs_req_cleanup(&stat_req);
    pcStack_660 = (code *)0x158d8c;
    uVar21 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_658 = 0;
    pcStack_660 = (code *)0x158dce;
    iov = uVar21;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,write_req.result + 10);
    if (iVar3 != 0) goto LAB_00158e87;
    if (read_req.result != 0) goto LAB_00158e8c;
    pcStack_660 = (code *)0x158df0;
    uv_fs_req_cleanup(&read_req);
    pcStack_660 = (code *)0x158e06;
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar3 != 0) goto LAB_00158e91;
    if (close_req.result == 0) {
      pcStack_660 = (code *)0x158e24;
      uv_fs_req_cleanup(&close_req);
      pcStack_660 = (code *)0x158e30;
      unlink("test_file");
      free(pvVar11);
      return extraout_EAX_00;
    }
  }
  pcStack_660 = run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  pcStack_660 = (code *)pvVar11;
  loop = (uv_loop_t *)uv_default_loop();
  rmdir("test_dir");
  iVar3 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar3 == 0) {
    uv_run(loop,0);
    if (mkdir_cb_count != 1) goto LAB_0015900d;
    iVar3 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,0);
    if (iVar3 < 0) goto LAB_00159012;
    uv_fs_req_cleanup(&open_req1);
    uVar21 = (uv_buf_t)uv_buf_init(auStack_662,2);
    iov = uVar21;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0,0);
    if (iVar3 != -0x15) goto LAB_00159017;
    uv_fs_req_cleanup(&read_req);
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar3 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      uVar7 = uv_default_loop();
      uv_walk(uVar7,close_walk_cb,0);
      uv_run(uVar7,0);
      uVar7 = uv_default_loop();
      iVar3 = uv_loop_close(uVar7);
      if (iVar3 == 0) {
        return 0;
      }
      goto LAB_00159021;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_0015900d:
    run_test_fs_read_dir_cold_2();
LAB_00159012:
    run_test_fs_read_dir_cold_3();
LAB_00159017:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_00159021:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return 0;
}

Assistant:

TEST_IMPL(fs_open_dir) {
  const char* path;
  uv_fs_t req;
  int r, file;

  path = ".";
  loop = uv_default_loop();

  r = uv_fs_open(NULL, &req, path, O_RDONLY, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  ASSERT(req.ptr == NULL);
  file = r;
  uv_fs_req_cleanup(&req);

  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT(r == 0);

  r = uv_fs_open(loop, &req, path, O_RDONLY, 0, open_cb_simple);
  ASSERT(r == 0);

  ASSERT(open_cb_count == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(open_cb_count == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}